

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStrUtil.cpp
# Opt level: O3

ostream * eglu::operator<<(ostream *str,ContextAttribValueFmt *attribFmt)

{
  deUint32 dVar1;
  ostream *poVar2;
  Enum<int,_2UL> local_10;
  
  dVar1 = attribFmt->attribute;
  if ((int)dVar1 < 0x3097) {
    if (dVar1 == 0x3028) {
LAB_0043632d:
      poVar2 = (ostream *)std::ostream::operator<<(str,attribFmt->value);
      return poVar2;
    }
    if (dVar1 != 0x3086) {
LAB_0043633c:
      local_10.m_getName = (GetNameFunc)(ulong)(uint)attribFmt->value;
      poVar2 = tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_10,str);
      return poVar2;
    }
    local_10.m_value = attribFmt->value;
    local_10.m_getName = getRenderBufferName;
  }
  else {
    if (dVar1 != 0x3097) {
      if (dVar1 != 0x3098) goto LAB_0043633c;
      goto LAB_0043632d;
    }
    local_10.m_value = attribFmt->value;
    local_10.m_getName = getAPIName;
  }
  poVar2 = tcu::Format::Enum<int,_2UL>::toStream(&local_10,str);
  return poVar2;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const ContextAttribValueFmt& attribFmt)
{
	switch (attribFmt.attribute)
	{
		case EGL_CONFIG_ID:
		case EGL_CONTEXT_CLIENT_VERSION:
			return str << (int)attribFmt.value;

		case EGL_CONTEXT_CLIENT_TYPE:
			return str << getAPIStr(attribFmt.value);

		case EGL_RENDER_BUFFER:
			return str << getRenderBufferStr(attribFmt.value);

		default:
			return str << tcu::toHex(attribFmt.value);
	}
}